

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * parserStackRealloc(void *pOld,sqlite3_uint64 newSize)

{
  int iVar1;
  undefined8 local_20;
  sqlite3_uint64 newSize_local;
  void *pOld_local;
  
  iVar1 = sqlite3FaultSim(700);
  if (iVar1 == 0) {
    local_20 = sqlite3_realloc(pOld,(int)newSize);
  }
  else {
    local_20 = (void *)0x0;
  }
  return local_20;
}

Assistant:

static void *parserStackRealloc(void *pOld, sqlite3_uint64 newSize){
    return sqlite3FaultSim(700) ? 0 : sqlite3_realloc(pOld, newSize);
  }